

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

bool __thiscall
btClosestNotMeConvexResultCallback::needsCollision
          (btClosestNotMeConvexResultCallback *this,btBroadphaseProxy *proxy0)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  btBroadphaseProxy *in_RSI;
  ConvexResultCallback *in_RDI;
  btCollisionObject *otherObj;
  bool local_1;
  
  if (in_RSI->m_clientObject == *(void **)&in_RDI[5].m_closestHitFraction) {
    local_1 = false;
  }
  else {
    bVar2 = btCollisionWorld::ConvexResultCallback::needsCollision(in_RDI,in_RSI);
    if (bVar2) {
      uVar1._0_4_ = in_RDI[5].m_closestHitFraction;
      uVar1._4_2_ = in_RDI[5].m_collisionFilterGroup;
      uVar1._6_2_ = in_RDI[5].m_collisionFilterMask;
      uVar3 = (**(code **)(*in_RDI[7]._vptr_ConvexResultCallback + 0x38))
                        (in_RDI[7]._vptr_ConvexResultCallback,uVar1,in_RSI->m_clientObject);
      if ((uVar3 & 1) == 0) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

virtual bool needsCollision(btBroadphaseProxy* proxy0) const
	{
		//don't collide with itself
		if (proxy0->m_clientObject == m_me)
			return false;

		///don't do CCD when the collision filters are not matching
		if (!ClosestConvexResultCallback::needsCollision(proxy0))
			return false;

		btCollisionObject* otherObj = (btCollisionObject*) proxy0->m_clientObject;

		//call needsResponse, see http://code.google.com/p/bullet/issues/detail?id=179
		if (m_dispatcher->needsResponse(m_me,otherObj))
		{
#if 0
			///don't do CCD when there are already contact points (touching contact/penetration)
			btAlignedObjectArray<btPersistentManifold*> manifoldArray;
			btBroadphasePair* collisionPair = m_pairCache->findPair(m_me->getBroadphaseHandle(),proxy0);
			if (collisionPair)
			{
				if (collisionPair->m_algorithm)
				{
					manifoldArray.resize(0);
					collisionPair->m_algorithm->getAllContactManifolds(manifoldArray);
					for (int j=0;j<manifoldArray.size();j++)
					{
						btPersistentManifold* manifold = manifoldArray[j];
						if (manifold->getNumContacts()>0)
							return false;
					}
				}
			}
#endif
			return true;
		}

		return false;
	}